

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createSCmpLT(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  BasicBlock *pBVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  string local_80;
  Value *local_60;
  Value *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_60 = rhs;
  local_58 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x1c3,
                  "Value *flow::IRBuilder::createSCmpLT(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ == String) {
    if (lhs == (Value *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(lhs,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    }
    if (lVar3 == 0) {
      bVar5 = true;
    }
    else {
      if (rhs == (Value *)0x0) {
        rhs = (Value *)0x0;
      }
      else {
        rhs = (Value *)__dynamic_cast(rhs,&Value::typeinfo,
                                      &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                       typeinfo,0);
      }
      bVar5 = (BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)rhs ==
              (BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)0x0;
      if (!bVar5) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,*(long *)(lVar3 + 0x48),
                   *(long *)(lVar3 + 0x50) + *(long *)(lVar3 + 0x48));
        pBVar1 = (((BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)rhs)->super_Instr)
                 .basicBlock_;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pBVar1,
                   (long)&(pBVar1->super_Value)._vptr_Value +
                   (long)(((BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)rhs)->
                         super_Instr).operands_.
                         super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                         super__Vector_impl_data._M_start);
        uVar4 = local_80._M_string_length;
        if (local_48 < local_80._M_string_length) {
          uVar4 = local_48;
        }
        if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          uVar2 = memcmp(local_80._M_dataplus._M_p,local_50,uVar4);
          uVar4 = (ulong)uVar2;
        }
        if ((int)uVar4 == 0) {
          uVar4 = 0xffffffff80000000;
          if (-0x80000000 < (long)(local_80._M_string_length - local_48)) {
            uVar4 = local_80._M_string_length - local_48;
          }
          if (0x7ffffffe < (long)uVar4) {
            uVar4 = 0x7fffffff;
          }
        }
        lVar3 = 0x68;
        if ((int)uVar4 < 0) {
          lVar3 = 0x18;
        }
        rhs = (Value *)((long)&(this->program_->modules_).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (bVar5) {
      makeName(&local_80,this,name);
      rhs = (Value *)insert<flow::BinaryInstr<(flow::BinaryOperator)26,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                               (this,&local_58,&local_60,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    return (Value *)(BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)rhs;
  }
  __assert_fail("lhs->type() == LiteralType::String",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x1c4,"Value *flow::IRBuilder::createSCmpLT(Value *, Value *, const std::string &)"
               );
}

Assistant:

Value* IRBuilder::createSCmpLT(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::String);

  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(a->get() < b->get());

  return insert<SCmpLTInstr>(lhs, rhs, makeName(name));
}